

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chi_square_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::chi_square_dist<long_double>::pdf(chi_square_dist<long_double> *this,result_type_conflict3 x)

{
  int iVar1;
  param_type *extraout_RAX;
  param_type *in_RDI;
  double __x;
  double __x_00;
  double in_XMM1_Qa;
  longdouble in_stack_00000008;
  undefined6 in_stack_ffffffffffffff72;
  undefined2 uVar2;
  
  if ((longdouble)0 <= in_stack_00000008) {
    iVar1 = param_type::nu(in_RDI);
    uVar2 = SUB102(-(longdouble)1 + (longdouble)iVar1 * (longdouble)0.5,0);
    std::pow(__x,in_XMM1_Qa);
    iVar1 = param_type::nu(in_RDI);
    math::ln_Gamma((longdouble)
                   CONCAT28(uVar2,CONCAT62(in_stack_ffffffffffffff72,
                                           (short)((unkuint10)((longdouble)iVar1 * (longdouble)0.5)
                                                  >> 0x40))));
    std::exp(__x_00);
    in_RDI = extraout_RAX;
  }
  return (result_type_conflict3 *)in_RDI;
}

Assistant:

pdf(result_type x) const {
      if (x < 0)
        return 0;
      x /= 2;
      return math::pow(x, P.nu() / result_type(2) - 1) /
             (math::exp(x + math::ln_Gamma(P.nu() / result_type(2))) * 2);
    }